

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.h
# Opt level: O1

void __thiscall
llvm::DWARFExpression::iterator::iterator(iterator *this,DWARFExpression *Expr,uint64_t Offset)

{
  bool bVar1;
  
  this->Expr = Expr;
  this->Offset = Offset;
  (this->Op).Desc.Version = DwarfNA;
  (this->Op).Desc.Op[0] = SizeNA;
  (this->Op).Desc.Op[1] = SizeNA;
  bVar1 = true;
  if (Offset < (Expr->Data).Data.Length) {
    bVar1 = Operation::extract(&this->Op,Expr->Data,Expr->Version,Expr->AddressSize,Offset);
    bVar1 = !bVar1;
  }
  (this->Op).Error = bVar1;
  return;
}

Assistant:

iterator(const DWARFExpression *Expr, uint64_t Offset)
        : Expr(Expr), Offset(Offset) {
      Op.Error =
          Offset >= Expr->Data.getData().size() ||
          !Op.extract(Expr->Data, Expr->Version, Expr->AddressSize, Offset);
    }